

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O2

void __thiscall SQOuterVar::SQOuterVar(SQOuterVar *this,SQOuterVar *ov)

{
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_src).super_SQObject._type = OT_NULL;
  (this->_src).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_type = ov->_type;
  SQObjectPtr::operator=(&this->_src,&ov->_src);
  SQObjectPtr::operator=(&this->_name,&ov->_name);
  return;
}

Assistant:

SQOuterVar(const SQOuterVar &ov)
    {
        _type=ov._type;
        _src=ov._src;
        _name=ov._name;
    }